

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::PerPatchDataCase::getCaseTypeName(CaseType type)

{
  char *pcStack_10;
  CaseType type_local;
  
  switch(type) {
  case CASETYPE_PRIMITIVE_ID_TCS:
    pcStack_10 = "primitive_id_tcs";
    break;
  case CASETYPE_PRIMITIVE_ID_TES:
    pcStack_10 = "primitive_id_tes";
    break;
  case CASETYPE_PATCH_VERTICES_IN_TCS:
    pcStack_10 = "patch_vertices_in_tcs";
    break;
  case CASETYPE_PATCH_VERTICES_IN_TES:
    pcStack_10 = "patch_vertices_in_tes";
    break;
  case CASETYPE_TESS_LEVEL_INNER0_TES:
    pcStack_10 = "tess_level_inner_0_tes";
    break;
  case CASETYPE_TESS_LEVEL_INNER1_TES:
    pcStack_10 = "tess_level_inner_1_tes";
    break;
  case CASETYPE_TESS_LEVEL_OUTER0_TES:
    pcStack_10 = "tess_level_outer_0_tes";
    break;
  case CASETYPE_TESS_LEVEL_OUTER1_TES:
    pcStack_10 = "tess_level_outer_1_tes";
    break;
  case CASETYPE_TESS_LEVEL_OUTER2_TES:
    pcStack_10 = "tess_level_outer_2_tes";
    break;
  case CASETYPE_TESS_LEVEL_OUTER3_TES:
    pcStack_10 = "tess_level_outer_3_tes";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* PerPatchDataCase::getCaseTypeName (CaseType type)
{
	switch (type)
	{
		case CASETYPE_PRIMITIVE_ID_TCS:			return "primitive_id_tcs";
		case CASETYPE_PRIMITIVE_ID_TES:			return "primitive_id_tes";
		case CASETYPE_PATCH_VERTICES_IN_TCS:	return "patch_vertices_in_tcs";
		case CASETYPE_PATCH_VERTICES_IN_TES:	return "patch_vertices_in_tes";
		case CASETYPE_TESS_LEVEL_INNER0_TES:	return "tess_level_inner_0_tes";
		case CASETYPE_TESS_LEVEL_INNER1_TES:	return "tess_level_inner_1_tes";
		case CASETYPE_TESS_LEVEL_OUTER0_TES:	return "tess_level_outer_0_tes";
		case CASETYPE_TESS_LEVEL_OUTER1_TES:	return "tess_level_outer_1_tes";
		case CASETYPE_TESS_LEVEL_OUTER2_TES:	return "tess_level_outer_2_tes";
		case CASETYPE_TESS_LEVEL_OUTER3_TES:	return "tess_level_outer_3_tes";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}